

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dominator_tree.h
# Opt level: O0

iterator * __thiscall
spvtools::opt::DominatorTree::begin(iterator *__return_storage_ptr__,DominatorTree *this)

{
  DominatorTreeNode *top_node;
  TreeDFIterator<spvtools::opt::DominatorTreeNode> *pTVar1;
  TreeDFIterator<spvtools::opt::DominatorTreeNode> local_70;
  DominatorTree *local_18;
  DominatorTree *this_local;
  
  local_18 = this;
  this_local = (DominatorTree *)__return_storage_ptr__;
  top_node = GetRoot(this);
  TreeDFIterator<spvtools::opt::DominatorTreeNode>::TreeDFIterator(&local_70,top_node);
  pTVar1 = TreeDFIterator<spvtools::opt::DominatorTreeNode>::operator++(&local_70);
  TreeDFIterator<spvtools::opt::DominatorTreeNode>::TreeDFIterator(__return_storage_ptr__,pTVar1);
  TreeDFIterator<spvtools::opt::DominatorTreeNode>::~TreeDFIterator(&local_70);
  return __return_storage_ptr__;
}

Assistant:

iterator begin() { return ++iterator(GetRoot()); }